

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_app.cpp
# Opt level: O3

void unariesFromLabelling(int *inputLabelling,float *outputUnary,int W,int H,int dim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  float *pfVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  float fVar11;
  int iVar12;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  
  dVar9 = log(1.0 / (double)dim);
  dVar10 = log(0.30000001192092896 / (double)(dim + -1));
  auVar3 = _DAT_00106040;
  auVar2 = _DAT_00106030;
  auVar1 = _DAT_00106020;
  if (0 < W * H) {
    fVar11 = (float)dVar9;
    fVar8 = (float)dVar10;
    lVar4 = (ulong)(uint)dim - 1;
    auVar13._8_4_ = (int)lVar4;
    auVar13._0_8_ = lVar4;
    auVar13._12_4_ = (int)((ulong)lVar4 >> 0x20);
    pfVar5 = outputUnary + 3;
    lVar4 = (ulong)(dim + 3U >> 2) << 4;
    uVar6 = 0;
    auVar13 = auVar13 ^ _DAT_00106040;
    do {
      iVar22 = inputLabelling[uVar6];
      iVar12 = auVar13._0_4_;
      iVar14 = auVar13._4_4_;
      iVar15 = auVar13._12_4_;
      if ((long)iVar22 < 0) {
        if (0 < dim) {
          lVar7 = 0;
          auVar19 = auVar2;
          auVar18 = auVar1;
          do {
            auVar20 = auVar19 ^ auVar3;
            if ((bool)(~(auVar20._4_4_ == iVar14 && iVar12 < auVar20._0_4_ || iVar14 < auVar20._4_4_
                        ) & 1)) {
              *(float *)((long)pfVar5 + lVar7 + -0xc) = fVar11;
            }
            if ((auVar20._12_4_ != iVar15 || auVar20._8_4_ <= auVar13._8_4_) &&
                auVar20._12_4_ <= iVar15) {
              *(float *)((long)pfVar5 + lVar7 + -8) = fVar11;
            }
            iVar22 = SUB164(auVar18 ^ auVar3,4);
            if (iVar22 <= iVar14 && (iVar22 != iVar14 || SUB164(auVar18 ^ auVar3,0) <= iVar12)) {
              *(float *)((long)pfVar5 + lVar7 + -4) = fVar11;
              *(float *)((long)pfVar5 + lVar7) = fVar11;
            }
            lVar16 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 4;
            auVar19._8_8_ = lVar16 + 4;
            lVar16 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 4;
            auVar18._8_8_ = lVar16 + 4;
            lVar7 = lVar7 + 0x10;
          } while (lVar4 != lVar7);
        }
      }
      else {
        if (0 < dim) {
          lVar7 = 0;
          auVar20 = auVar2;
          auVar17 = auVar1;
          do {
            auVar19 = auVar20 ^ auVar3;
            if ((bool)(~(auVar19._4_4_ == iVar14 && iVar12 < auVar19._0_4_ || iVar14 < auVar19._4_4_
                        ) & 1)) {
              *(float *)((long)pfVar5 + lVar7 + -0xc) = fVar8;
            }
            if ((auVar19._12_4_ != iVar15 || auVar19._8_4_ <= auVar13._8_4_) &&
                auVar19._12_4_ <= iVar15) {
              *(float *)((long)pfVar5 + lVar7 + -8) = fVar8;
            }
            iVar21 = SUB164(auVar17 ^ auVar3,4);
            if (iVar21 <= iVar14 && (iVar21 != iVar14 || SUB164(auVar17 ^ auVar3,0) <= iVar12)) {
              *(float *)((long)pfVar5 + lVar7 + -4) = fVar8;
              *(float *)((long)pfVar5 + lVar7) = fVar8;
            }
            lVar16 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 4;
            auVar20._8_8_ = lVar16 + 4;
            lVar16 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 4;
            auVar17._8_8_ = lVar16 + 4;
            lVar7 = lVar7 + 0x10;
          } while (lVar4 != lVar7);
        }
        outputUnary[uVar6 * (long)dim + (long)iVar22] = -0.35667497;
      }
      uVar6 = uVar6 + 1;
      pfVar5 = pfVar5 + (uint)dim;
    } while (uVar6 != (uint)(W * H));
  }
  return;
}

Assistant:

void unariesFromLabelling(const int *inputLabelling, float *outputUnary, int W, int H, int dim) {
    const float GT_PROB = 0.7;
    const float u_energy = log(1.0 / dim);
    const float n_energy = log((1.0 - GT_PROB) / (dim - 1));
    const float p_energy = log(GT_PROB);

    for (int i = 0; i < W*H; i++) {
        if (inputLabelling[i] >= 0) {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = n_energy;
            }
            outputUnary[i*dim + inputLabelling[i]] = p_energy;
        }
        else {
            for (int k = 0; k < dim; k++) {
                outputUnary[i*dim + k] = u_energy;
            }
        }
    }
}